

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * defaultRealloc(TidyAllocator *allocator,void *mem,size_t newsize)

{
  TidyAllocator *local_38;
  void *p;
  size_t newsize_local;
  void *mem_local;
  TidyAllocator *allocator_local;
  
  if (mem == (void *)0x0) {
    allocator_local = (TidyAllocator *)defaultAlloc(allocator,newsize);
  }
  else {
    if (g_realloc == (TidyRealloc)0x0) {
      local_38 = (TidyAllocator *)realloc(mem,newsize);
    }
    else {
      local_38 = (TidyAllocator *)(*g_realloc)(mem,newsize);
    }
    if (local_38 == (TidyAllocator *)0x0) {
      defaultPanic(allocator,"Out of memory!");
    }
    allocator_local = local_38;
  }
  return allocator_local;
}

Assistant:

static void* TIDY_CALL defaultRealloc( TidyAllocator* allocator, void* mem, size_t newsize )
{
    void *p;
    if ( mem == NULL )
        return defaultAlloc( allocator, newsize );

    p = ( g_realloc ? g_realloc(mem, newsize) : realloc(mem, newsize) );
    if (!p)
        defaultPanic( allocator, "Out of memory!");
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_MEMORY)
    realloccnt++;
    SPRTF("%d: realloc MEM %p, size %d\n", realloccnt, p, (int)newsize );
#endif
    return p;
}